

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  int iVar1;
  int local_3c;
  int t;
  int dc;
  int diff;
  int b_local;
  stbi__huffman *hdc_local;
  short *data_local;
  stbi__jpeg *j_local;
  
  if (j->spec_end == 0) {
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->succ_high == 0) {
      memset(data,0,0x80);
      iVar1 = stbi__jpeg_huff_decode(j,hdc);
      if (iVar1 == -1) {
        iVar1 = stbi__err("can\'t merge dc and ac");
        return iVar1;
      }
      if (iVar1 == 0) {
        local_3c = 0;
      }
      else {
        local_3c = stbi__extend_receive(j,iVar1);
      }
      local_3c = j->img_comp[b].dc_pred + local_3c;
      j->img_comp[b].dc_pred = local_3c;
      *data = (short)(local_3c << ((byte)j->succ_low & 0x1f));
    }
    else {
      iVar1 = stbi__jpeg_get_bit(j);
      if (iVar1 != 0) {
        *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
      }
    }
    j_local._4_4_ = 1;
  }
  else {
    j_local._4_4_ = stbi__err("can\'t merge dc and ac");
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t == -1) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc << j->succ_low);
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}